

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.c
# Opt level: O0

dtl_av_t * apx_vm_deserializer_take_av(apx_vm_deserializer_t *self)

{
  dtl_av_t *retval;
  apx_vm_deserializer_t *self_local;
  
  if ((self == (apx_vm_deserializer_t *)0x0) || (self->state->value_type != DTL_DV_ARRAY)) {
    self_local = (apx_vm_deserializer_t *)0x0;
  }
  else {
    self_local = (apx_vm_deserializer_t *)(self->state->value).sv;
    self->state->value_type = DTL_DV_NULL;
    (self->state->value).sv = (dtl_sv_t *)0x0;
  }
  return (dtl_av_t *)self_local;
}

Assistant:

dtl_av_t* apx_vm_deserializer_take_av(apx_vm_deserializer_t* self)
{
   if ((self != NULL) && (self->state->value_type == DTL_DV_ARRAY))
   {
      dtl_av_t* retval = self->state->value.av;
      self->state->value_type = DTL_DV_NULL;
      self->state->value.dv = NULL;
      return retval;
   }
   return NULL;
}